

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageDivide(StackInterpreter *this)

{
  StackMemory *pSVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  Oop selector;
  double dVar9;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  
  pSVar1 = this->stack;
  puVar2 = (ulong *)(pSVar1->stackFrame).stackPointer;
  puVar3 = (ulong *)*puVar2;
  puVar4 = (ulong *)puVar2[1];
  uVar8 = (uint)puVar3;
  uVar12 = (uint)puVar4;
  lVar11 = (long)puVar3 >> 1;
  if ((uVar8 & uVar12 & 1) != 0) {
    auVar7._8_8_ = (long)puVar4 >> 0x3f;
    auVar7._0_8_ = (long)puVar4 >> 1;
    if (SUB168(auVar7 % SEXT816(lVar11),0) == 0) {
      (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 1);
      puVar2[1] = SUB168(auVar7 / SEXT816(lVar11),0) * 2 + 1;
      return;
    }
LAB_001489da:
    selector = VMContext::getSpecialMessageSelector(this->context,Divide);
    sendSelectorArgumentCount(this,selector,1,false);
    return;
  }
  if ((((((ulong)puVar4 & 1) == 0) && ((uVar12 & 6) != 4)) &&
      ((((ulong)puVar4 & 6) != 0 || ((uint)(*puVar4 >> 0x2a) != 0x22)))) ||
     (((((ulong)puVar3 & 1) == 0 && ((uVar8 & 6) != 4)) &&
      ((((ulong)puVar3 & 6) != 0 || ((uint)(*puVar3 >> 0x2a) != 0x22)))))) goto LAB_001489da;
  sVar5 = this->pc;
  this->pc = sVar5 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar5);
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
  if (((ulong)puVar4 & 1) == 0) {
    uVar12 = uVar12 & 6;
    if (uVar12 != 4) {
      if ((((ulong)puVar4 & 6) != 0) || ((uint)(*puVar4 >> 0x2a) != 0x22)) goto LAB_00148ab0;
      if (uVar12 != 4) {
        if ((((ulong)puVar4 & 6) != 0) || ((*puVar4 & 0xfffffc0000000000) != 0x880000000000))
        goto LAB_00148acf;
        if (uVar12 != 4) {
          dVar14 = (double)puVar4[1];
          goto LAB_00148a02;
        }
      }
    }
    uVar13 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
    dVar14 = (double)(uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f);
  }
  else {
    dVar14 = (double)((long)puVar4 >> 1);
  }
LAB_00148a02:
  if (((ulong)puVar3 & 1) == 0) {
    uVar8 = uVar8 & 6;
    if (uVar8 != 4) {
      if ((((ulong)puVar3 & 6) != 0) || ((uint)(*puVar3 >> 0x2a) != 0x22)) {
LAB_00148ab0:
        __assert_fail("isFloatOrInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
      }
      if (uVar8 != 4) {
        if ((((ulong)puVar3 & 6) != 0) || ((*puVar3 & 0xfffffc0000000000) != 0x880000000000)) {
LAB_00148acf:
          __assert_fail("isFloat()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                        ,0x216,"double Lodtalk::Oop::decodeFloat() const");
        }
        if (uVar8 != 4) {
          dVar9 = (double)puVar3[1];
          goto LAB_00148a7d;
        }
      }
    }
    uVar13 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
    dVar9 = (double)(uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f);
  }
  else {
    dVar9 = (double)lVar11;
  }
LAB_00148a7d:
  aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)
           VMContext::floatObjectFor(this->context,dVar14 / dVar9);
  puVar6 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar6 + -8;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar6 + -8) = aVar10;
  return;
}

Assistant:

void interpretSpecialMessageDivide()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            if(ia % ib == 0)
            {
                popMultiplesOops(2);
                fetchNextInstructionOpcode();

                pushOop(Oop::encodeSmallInteger(ia / ib));
            }
            else
            {
                // Allow the image side to make a fraction.
                sendSpecialArgumentCount(SpecialMessageSelector::Divide, 1);
            }
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa / fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Divide, 1);
        }
    }